

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::Option::get_flag_value
          (string *__return_storage_ptr__,Option *this,string *name,string *input_value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  pointer pcVar3;
  pointer ppVar4;
  size_t __n;
  bool bVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  ptrdiff_t pVar9;
  ArgumentMismatch *pAVar10;
  ulong uVar11;
  string *psVar12;
  ulong uVar13;
  string *__str;
  uint __len;
  ulong __val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::trueString_abi_cxx11_ ==
       '\0') &&
     (iVar8 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::trueString_abi_cxx11_), iVar8 != 0)) {
    get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::trueString_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                   trueString_abi_cxx11_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                trueString_abi_cxx11_,"true","");
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         trueString_abi_cxx11_);
  }
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::falseString_abi_cxx11_ ==
       '\0') &&
     (iVar8 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::falseString_abi_cxx11_), iVar8 != 0)) {
    get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::falseString_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                   falseString_abi_cxx11_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                falseString_abi_cxx11_,"false","");
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  falseString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         falseString_abi_cxx11_);
  }
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::emptyString_abi_cxx11_ ==
       '\0') &&
     (iVar8 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::emptyString_abi_cxx11_), iVar8 != 0)) {
    get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::emptyString_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                   emptyString_abi_cxx11_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                emptyString_abi_cxx11_,"{}","");
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  emptyString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         emptyString_abi_cxx11_);
  }
  if ((((this->super_OptionBase<CLI::Option>).disable_flag_override_ == true) &&
      (sVar2 = input_value->_M_string_length, sVar2 != 0)) &&
     ((sVar2 != get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                emptyString_abi_cxx11_._M_string_length ||
      (iVar8 = bcmp((input_value->_M_dataplus)._M_p,
                    get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                    emptyString_abi_cxx11_._M_dataplus._M_p,sVar2), iVar8 != 0)))) {
    pcVar3 = (name->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + name->_M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_e8,&this->fnames_);
    pVar9 = detail::find_member(&local_90,&local_e8,
                                (this->super_OptionBase<CLI::Option>).ignore_case_,
                                (this->super_OptionBase<CLI::Option>).ignore_underscore_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (pVar9 < 0) {
      sVar2 = input_value->_M_string_length;
      if ((sVar2 != get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                    trueString_abi_cxx11_._M_string_length) ||
         ((sVar2 != 0 &&
          (iVar8 = bcmp((input_value->_M_dataplus)._M_p,
                        get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                        trueString_abi_cxx11_._M_dataplus._M_p,sVar2), iVar8 != 0)))) {
        pAVar10 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar3 = (name->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar3,pcVar3 + name->_M_string_length);
        ArgumentMismatch::FlagOverride(pAVar10,&local_70);
        __cxa_throw(pAVar10,&ArgumentMismatch::typeinfo,Error::~Error);
      }
    }
    else {
      ppVar4 = (this->default_flag_values_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar2 = ppVar4[pVar9].second._M_string_length;
      if ((sVar2 != input_value->_M_string_length) ||
         ((sVar2 != 0 &&
          (iVar8 = bcmp(ppVar4[pVar9].second._M_dataplus._M_p,(input_value->_M_dataplus)._M_p,sVar2)
          , iVar8 != 0)))) {
        pAVar10 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar3 = (name->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar3,pcVar3 + name->_M_string_length);
        ArgumentMismatch::FlagOverride(pAVar10,&local_50);
        __cxa_throw(pAVar10,&ArgumentMismatch::typeinfo,Error::~Error);
      }
    }
  }
  pcVar3 = (name->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar3,pcVar3 + name->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_100,&this->fnames_);
  pVar9 = detail::find_member(&local_b0,&local_100,
                              (this->super_OptionBase<CLI::Option>).ignore_case_,
                              (this->super_OptionBase<CLI::Option>).ignore_underscore_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  sVar2 = input_value->_M_string_length;
  if ((sVar2 == 0) ||
     ((sVar2 == get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                emptyString_abi_cxx11_._M_string_length &&
      (iVar8 = bcmp((input_value->_M_dataplus)._M_p,
                    get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                    emptyString_abi_cxx11_._M_dataplus._M_p,sVar2), iVar8 == 0)))) {
    if (this->flag_like_ == true) {
      psVar12 = &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                 trueString_abi_cxx11_;
      if (-1 < pVar9) {
        psVar12 = &(this->default_flag_values_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[pVar9].second;
      }
    }
    else {
      psVar12 = &(this->default_flag_values_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[pVar9].second;
      if (pVar9 < 0) {
        psVar12 = &this->default_str_;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (psVar12->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar12->_M_string_length);
  }
  else {
    if (-1 < pVar9) {
      ppVar4 = (this->default_flag_values_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __n = ppVar4[pVar9].second._M_string_length;
      if ((__n == get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  falseString_abi_cxx11_._M_string_length) &&
         ((__n == 0 ||
          (iVar8 = bcmp(ppVar4[pVar9].second._M_dataplus._M_p,
                        get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                        falseString_abi_cxx11_._M_dataplus._M_p,__n), iVar8 == 0)))) {
        pcVar3 = (input_value->_M_dataplus)._M_p;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char*>((string *)&local_d0,pcVar3,pcVar3 + sVar2);
        uVar11 = detail::to_flag_value(&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if (uVar11 == 1) {
          psVar12 = &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                     falseString_abi_cxx11_;
        }
        else {
          if (uVar11 != 0xffffffffffffffff) {
            __val = -uVar11;
            if (0 < (long)uVar11) {
              __val = uVar11;
            }
            __len = 1;
            if (9 < __val) {
              uVar13 = __val;
              uVar7 = 4;
              do {
                __len = uVar7;
                if (uVar13 < 100) {
                  __len = __len - 2;
                  goto LAB_00127e43;
                }
                if (uVar13 < 1000) {
                  __len = __len - 1;
                  goto LAB_00127e43;
                }
                if (uVar13 < 10000) goto LAB_00127e43;
                bVar5 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                uVar7 = __len + 4;
              } while (bVar5);
              __len = __len + 1;
            }
LAB_00127e43:
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            ::std::__cxx11::string::_M_construct
                      ((ulong)__return_storage_ptr__,(0 < (long)uVar11) + (char)__len);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((__return_storage_ptr__->_M_dataplus)._M_p + (0 < (long)uVar11),__len,__val);
            return __return_storage_ptr__;
          }
          psVar12 = &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                     trueString_abi_cxx11_;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = (psVar12->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar12->_M_string_length);
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (input_value->_M_dataplus)._M_p;
    paVar1 = &input_value->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      uVar6 = *(undefined8 *)((long)&input_value->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = sVar2;
    (input_value->_M_dataplus)._M_p = (pointer)paVar1;
    input_value->_M_string_length = 0;
    (input_value->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_flag_value(const std::string &name, std::string input_value) const {
        static const std::string trueString{"true"};
        static const std::string falseString{"false"};
        static const std::string emptyString{"{}"};
        // check for disable flag override_
        if(disable_flag_override_) {
            if(!((input_value.empty()) || (input_value == emptyString))) {
                auto default_ind = detail::find_member(name, fnames_, ignore_case_, ignore_underscore_);
                if(default_ind >= 0) {
                    // We can static cast this to std::size_t because it is more than 0 in this block
                    if(default_flag_values_[static_cast<std::size_t>(default_ind)].second != input_value) {
                        throw(ArgumentMismatch::FlagOverride(name));
                    }
                } else {
                    if(input_value != trueString) {
                        throw(ArgumentMismatch::FlagOverride(name));
                    }
                }
            }
        }
        auto ind = detail::find_member(name, fnames_, ignore_case_, ignore_underscore_);
        if((input_value.empty()) || (input_value == emptyString)) {
            if(flag_like_) {
                return (ind < 0) ? trueString : default_flag_values_[static_cast<std::size_t>(ind)].second;
            } else {
                return (ind < 0) ? default_str_ : default_flag_values_[static_cast<std::size_t>(ind)].second;
            }
        }
        if(ind < 0) {
            return input_value;
        }
        if(default_flag_values_[static_cast<std::size_t>(ind)].second == falseString) {
            try {
                auto val = detail::to_flag_value(input_value);
                return (val == 1) ? falseString : (val == (-1) ? trueString : std::to_string(-val));
            } catch(const std::invalid_argument &) {
                return input_value;
            }
        } else {
            return input_value;
        }
    }